

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O0

EData * get_edges(LGraph G)

{
  int iVar1;
  int iVar2;
  EData *pEVar3;
  int in_stack_00000008;
  int in_stack_0000000c;
  EData *edges;
  ENode *node;
  int index;
  int j;
  int i;
  
  node._4_4_ = 0;
  pEVar3 = (EData *)malloc((long)in_stack_0000000c << 3);
  for (index = 0; index < in_stack_00000008; index = index + 1) {
    for (edges = *(EData **)(G.vexs + index); edges != (EData *)0x0; edges = *(EData **)(edges + 1))
    {
      iVar1._0_1_ = edges->start;
      iVar1._1_1_ = edges->end;
      iVar1._2_2_ = *(undefined2 *)&edges->field_0x2;
      if (index < iVar1) {
        pEVar3[node._4_4_].start = *(char *)&G.vexs[(long)index + -1].first_edge;
        iVar2._0_1_ = edges->start;
        iVar2._1_1_ = edges->end;
        iVar2._2_2_ = *(undefined2 *)&edges->field_0x2;
        pEVar3[node._4_4_].end = *(char *)&G.vexs[(long)iVar2 + -1].first_edge;
        pEVar3[node._4_4_].weight = edges->weight;
        node._4_4_ = node._4_4_ + 1;
      }
    }
  }
  return pEVar3;
}

Assistant:

EData* get_edges(LGraph G)
{
    int i,j;
    int index=0;
    ENode *node;
    EData *edges;

    edges = (EData*)malloc(G.edgnum*sizeof(EData));
    for (i=0; i<G.vexnum; i++)
    {
        node = G.vexs[i].first_edge;
        while (node != NULL)
        {
            if (node->ivex > i)
            {
                edges[index].start  = G.vexs[i].data;           // 起点
                edges[index].end    = G.vexs[node->ivex].data;  // 终点
                edges[index].weight = node->weight;             // 权
                index++;
            }
            node = node->next_edge;
        }
    }

    return edges;
}